

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void window_copy(Am_Object *window)

{
  Am_Window_ToDo *this;
  Am_Object local_30 [3];
  Am_Window_ToDo *local_18;
  Am_Window_ToDo *win_todo;
  Am_Object *window_local;
  
  win_todo = (Am_Window_ToDo *)window;
  Am_Object::Set(window,0x7d2,0,0);
  this = (Am_Window_ToDo *)operator_new(0x30);
  Am_Window_ToDo::Am_Window_ToDo(this);
  local_18 = this;
  Am_Object::operator=((Am_Object *)this,window);
  local_18->width = 0;
  local_18->height = 0;
  local_18->flags = 0;
  local_18->prev = (Am_Window_ToDo *)0x0;
  local_18->next = (Am_Window_ToDo *)0x0;
  Am_Object::Add(window,0x7d6,local_18,0);
  Am_Object::Am_Object(local_30,window);
  am_generic_renew_copied_comp(local_30);
  Am_Object::~Am_Object(local_30);
  return;
}

Assistant:

static void
window_copy(Am_Object window)
{
  window.Set(Am_DRAWONABLE, (0L));
  Am_Window_ToDo *win_todo = new Am_Window_ToDo;
  win_todo->window = window;
  win_todo->width = 0;
  win_todo->height = 0;
  win_todo->flags = 0;
  win_todo->prev = nullptr;
  win_todo->next = nullptr;
  window.Add(Am_TODO, (Am_Ptr)win_todo);
  am_generic_renew_copied_comp(window);

  //// NDY: window might be created as a part already (currently doesn't matter)
}